

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O0

string_view absl::FindLongestCommonSuffix(string_view a,string_view b)

{
  char *__str;
  unsigned_long *puVar1;
  const_pointer pvVar2;
  size_type sVar3;
  const_pointer pvVar4;
  size_type sVar5;
  bool bVar6;
  size_type count;
  char *pb;
  char *pa;
  size_type limit;
  size_type local_60;
  char *local_58;
  char *local_50;
  size_type local_48;
  size_type local_40;
  unsigned_long local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  string_view local_10;
  
  local_40 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
  local_48 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_30);
  puVar1 = std::min<unsigned_long>(&local_40,&local_48);
  local_38 = *puVar1;
  if (local_38 == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_10);
  }
  else {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_20);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_30);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_30);
    local_58 = pvVar4 + sVar5;
    local_60 = 0;
    __str = pvVar2 + sVar3;
    while( true ) {
      local_50 = __str + -1;
      local_58 = local_58 + -1;
      bVar6 = false;
      if (local_60 < local_38) {
        bVar6 = *local_50 == *local_58;
      }
      if (!bVar6) break;
      local_60 = local_60 + 1;
      __str = local_50;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_10,__str,local_60);
  }
  return local_10;
}

Assistant:

absl::string_view FindLongestCommonSuffix(absl::string_view a,
                                          absl::string_view b) {
  const absl::string_view::size_type limit = std::min(a.size(), b.size());
  if (limit == 0) return absl::string_view();

  const char* pa = a.data() + a.size() - 1;
  const char* pb = b.data() + b.size() - 1;
  absl::string_view::size_type count = (unsigned) 0;
  while (count < limit && *pa == *pb) {
    --pa;
    --pb;
    ++count;
  }

  return absl::string_view(++pa, count);
}